

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixClose(sqlite3_file *id)

{
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **pp_Var1;
  sqlite3_io_methods *p;
  sqlite3_io_methods *psVar2;
  unixInodeInfo *puVar3;
  unixInodeInfo *puVar4;
  sqlite3_mutex *psVar5;
  unixInodeInfo **ppuVar6;
  unixInodeInfo *pInode;
  
  verifyDbFile((unixFile *)id);
  unixUnlock(id,0);
  if (sqlite3Config.bCoreMutex != 0) {
    psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar5 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    }
  }
  p = id[2].pMethods;
  if (p != (sqlite3_io_methods *)0x0) {
    if (*(int *)&p->xSync != 0) {
      psVar2 = id[6].pMethods;
      psVar2->xClose = (_func_int_sqlite3_file_ptr *)p->xFileSize;
      p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)psVar2;
      *(undefined4 *)&id[3].pMethods = 0xffffffff;
      id[6].pMethods = (sqlite3_io_methods *)0x0;
    }
    pp_Var1 = &p->xWrite;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      closePendingFds((unixFile *)id);
      puVar3 = (unixInodeInfo *)p->xLock;
      puVar4 = (unixInodeInfo *)p->xUnlock;
      ppuVar6 = &inodeList;
      if (puVar4 != (unixInodeInfo *)0x0) {
        ppuVar6 = &puVar4->pNext;
      }
      *ppuVar6 = puVar3;
      if (puVar3 != (unixInodeInfo *)0x0) {
        puVar3->pPrev = puVar4;
      }
      sqlite3_free(p);
    }
  }
  closeUnixFile(id);
  if (sqlite3Config.bCoreMutex != 0) {
    psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar5 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    }
  }
  return 0;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  if( ALWAYS(pFile->pInode) && pFile->pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed 
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  releaseInodeInfo(pFile);
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}